

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.h
# Opt level: O3

void image_32_filter_75_case(response_layer *layer,integral_image *iimage)

{
  int iVar1;
  float *pfVar2;
  float *pfVar3;
  bool *pbVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  long lVar9;
  float *pfVar10;
  ulong uVar11;
  float *pfVar12;
  uint uVar13;
  uint uVar14;
  float *pfVar15;
  int iVar16;
  long lVar17;
  float *pfVar18;
  int iVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  long lVar25;
  float *pfVar26;
  long lVar27;
  float *pfVar28;
  int iVar29;
  float *pfVar30;
  long lVar31;
  float *pfVar32;
  int iVar33;
  long lVar34;
  int iVar35;
  bool *pbVar36;
  float fVar37;
  float afStack_178 [34];
  long local_f0;
  float *local_e8;
  long local_e0;
  float *data;
  long local_c0;
  long local_b8;
  float *local_b0;
  float *local_a8;
  float *local_a0;
  float *local_98;
  float *local_70;
  long local_68;
  float *local_60;
  
  iVar21 = layer->filter_size;
  uVar23 = iimage->width;
  local_e0 = (long)iimage->data_width;
  pfVar2 = iimage->data;
  iVar1 = layer->step;
  lVar31 = (long)iVar1;
  iVar29 = iVar21 / 3;
  lVar9 = -0x178 - ((ulong)uVar23 * 4 + 0xf & 0xfffffffffffffff0);
  lVar34 = layer->width * lVar31;
  iVar16 = (iimage->height + -1) * iimage->data_width;
  iVar33 = (int)lVar34;
  if (iVar33 - iVar29 == 0 || iVar33 < iVar29) {
    lVar20 = 0;
  }
  else {
    lVar20 = 0;
    do {
      *(float *)((long)afStack_178 + lVar20 * 4 + lVar9 + 0x178) =
           pfVar2[iVar29 + -1 + iVar16 + (int)lVar20];
      lVar20 = lVar20 + lVar31;
    } while (lVar20 < (long)(ulong)(uint)(iVar33 - iVar29));
  }
  fVar37 = pfVar2[(int)((uVar23 - 1) + iVar16)];
  pfVar10 = (float *)(long)iVar29;
  data = pfVar10;
  if ((int)lVar20 < iVar29) {
    lVar20 = (long)(int)lVar20;
    do {
      *(float *)((long)afStack_178 + lVar20 * 4 + lVar9 + 0x178) = fVar37;
      lVar20 = lVar20 + lVar31;
    } while (lVar20 < (long)pfVar10);
  }
  iVar35 = layer->height;
  iVar19 = (int)lVar20;
  if (iVar19 < iVar33) {
    lVar20 = (long)iVar19;
    iVar16 = (iVar16 + iVar19) - iVar29;
    do {
      lVar17 = (long)iVar16;
      iVar16 = iVar16 + iVar1;
      *(float *)((long)afStack_178 + lVar20 * 4 + lVar9 + 0x178) = fVar37 - pfVar2[lVar17];
      lVar20 = lVar20 + lVar31;
    } while (lVar20 < lVar34);
  }
  uVar23 = iVar35 * iVar1;
  if (0 < (int)uVar23) {
    local_c0 = 0;
    uVar13 = (iVar21 + -1) - (iVar21 + -1 >> 0x1f) >> 1;
    pfVar30 = pfVar2 + -local_e0;
    lVar20 = local_e0 * (long)data;
    fVar37 = 1.0 / (float)(iVar21 * iVar21);
    lVar24 = ((long)data + -1) * local_e0;
    lVar17 = ~(ulong)data * local_e0;
    pfVar15 = pfVar2 + ((int)uVar13 - lVar20);
    local_a8 = pfVar2 + lVar17;
    pfVar28 = pfVar2 + ((long)data - local_e0);
    uVar11 = (long)data * 4 ^ 0xfffffffffffffffc;
    lVar34 = (long)pfVar2 + uVar11;
    pfVar3 = layer->response;
    pbVar4 = layer->laplacian;
    uVar14 = ~(iVar21 / 6);
    iVar35 = (int)local_e0;
    iVar16 = uVar14 * iVar35;
    iVar29 = (iVar29 + uVar14) * iVar35;
    lVar22 = (long)(iVar21 / 6);
    local_68 = (local_e0 * -4 + 4) * (long)data + lVar22 * -4 + -4 + (long)pfVar2;
    local_a0 = pfVar2 + ((lVar24 + -1) - lVar22);
    lVar27 = uVar11 + local_e0 * -4 + (long)pfVar2;
    local_60 = pfVar2 + ((lVar17 + -1) - (long)data);
    local_70 = pfVar2 + (long)data + ((lVar24 + -1) - lVar22);
    local_b0 = pfVar2 + lVar20;
    lVar25 = lVar31 * local_e0;
    local_b8 = (lVar22 * 4 + lVar20 * 4 ^ 0xfffffffffffffffcU) + (long)pfVar2;
    lVar20 = lVar25 * 4;
    local_f0 = (local_e0 * 4 + -4) * (long)data + -4 + (long)pfVar2;
    pfVar12 = pfVar2 + lVar24 + (int)uVar13;
    iVar21 = 0;
    pfVar26 = (float *)((local_e0 * 4 + 4) * (long)data + (long)pfVar2);
    pfVar18 = pfVar2 + (long)(lVar17 + (long)data);
    pfVar10 = pfVar2 + (long)data;
    local_e8 = pfVar10;
    local_98 = pfVar2;
    do {
      if (0 < iVar33) {
        pfVar32 = pfVar3 + iVar21;
        pbVar36 = pbVar4 + iVar21;
        lVar17 = 0;
        uVar14 = ~uVar13;
        do {
          auVar8 = vfmadd213ss_fma(ZEXT416((uint)((pfVar2[(iVar16 + lVar17) - (long)data] -
                                                  pfVar2[(iVar29 + lVar17) - (long)data]) +
                                                 (pfVar10[(long)iVar29 + lVar17 + -2] -
                                                 pfVar10[(long)iVar16 + lVar17 + -2]))),
                                   SUB6416(ZEXT464(0xc0400000),0),
                                   ZEXT416(*(uint *)((long)afStack_178 + lVar17 * 4 + lVar9 + 0x178)
                                          ));
          fVar5 = fVar37 * auVar8._0_4_;
          auVar8 = vfmadd213ss_fma(ZEXT416((uint)((*(float *)(local_b8 + lVar17 * 4) -
                                                  local_a0[lVar17]) +
                                                 (local_70[lVar17] -
                                                 *(float *)(local_68 + lVar17 * 4)))),
                                   SUB6416(ZEXT464(0xc0400000),0),
                                   ZEXT416((uint)((pfVar2[(local_c0 - (long)data) * local_e0 +
                                                          (long)(int)uVar14] -
                                                  pfVar2[(local_c0 + -1 + (long)data) * local_e0 +
                                                         (long)(int)uVar14]) +
                                                 (pfVar12[lVar17] - pfVar15[lVar17]))));
          fVar6 = fVar37 * auVar8._0_4_;
          fVar7 = fVar37 * ((((local_a8[lVar17] - pfVar30[lVar17]) +
                              (pfVar28[lVar17] - pfVar18[lVar17]) +
                             (local_b0[lVar17 + -1] - local_98[lVar17 + -1]) +
                             (*(float *)(lVar34 + lVar17 * 4) - *(float *)(local_f0 + lVar17 * 4)))
                            - ((pfVar30[lVar17 + -1] - local_a8[lVar17 + -1]) +
                              (local_60[lVar17] - *(float *)(lVar27 + lVar17 * 4)))) -
                           ((pfVar26[lVar17] - local_e8[lVar17]) +
                           (local_98[lVar17] - local_b0[lVar17])));
          auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar7 * -0.81)),ZEXT416((uint)fVar6),
                                   ZEXT416((uint)fVar5));
          *pfVar32 = auVar8._0_4_;
          *pbVar36 = 0.0 <= fVar5 + fVar6;
          lVar17 = lVar17 + lVar31;
          uVar14 = uVar14 + iVar1;
          pfVar32 = pfVar32 + 1;
          pbVar36 = pbVar36 + 1;
          iVar21 = iVar21 + 1;
        } while (lVar17 < iVar33);
      }
      local_a8 = local_a8 + lVar25;
      local_98 = local_98 + lVar25;
      local_a0 = local_a0 + lVar25;
      local_b8 = local_b8 + lVar20;
      iVar16 = iVar16 + iVar1 * iVar35;
      local_c0 = local_c0 + lVar31;
      local_b0 = local_b0 + lVar25;
      pfVar12 = pfVar12 + lVar25;
      pfVar15 = pfVar15 + lVar25;
      pfVar30 = pfVar30 + lVar25;
      local_e8 = local_e8 + lVar25;
      local_70 = local_70 + lVar25;
      local_68 = local_68 + lVar20;
      local_60 = local_60 + lVar25;
      local_f0 = local_f0 + lVar20;
      lVar34 = lVar34 + lVar20;
      iVar29 = iVar29 + iVar1 * iVar35;
      pfVar26 = pfVar26 + lVar25;
      pfVar28 = pfVar28 + lVar25;
      pfVar18 = pfVar18 + lVar25;
      lVar27 = lVar27 + lVar20;
    } while (local_c0 < (long)(ulong)uVar23);
  }
  return;
}

Assistant:

inline void image_32_filter_75_case(struct response_layer *layer, struct integral_image *iimage) {
    int height = layer->height;
    int width = layer->width;

    int data_width = iimage->data_width;

    int iwidth = iimage->width;
    int iheight = iimage->height;

    float *data = (float *) iimage->data;
    int step = layer->step;
    int filter_size = layer->filter_size;
    int border = (filter_size - 1) / 2;
    int lobe = filter_size / 3;
    float inv_area = 1.f/(filter_size*filter_size);

    float Dxx, Dyy, Dxy, Dyy0, Dyy1, A, B, C, D;
    float A0, A1, B0, B1, C0, C1, D0, D1;
    int r10, r11, c10, c11, r00, r01, c00, c01;
    float* response = layer->response;
    bool* laplacian = layer->laplacian;

    int ind = 0;

    int k, k0, i, j, t0, t1, t2, t3, t4, t5, t6, t7, t8, t9;
    int x = 0;
    int y = 0;

    /* 2.2.b Half the filter is longer than the image, but narrower.
    // HERE: width > lobe and height <= border
    // Here only the whole filter is optimized, not negative part

    // Only happens for filter: 75 and image: 32

    // A, B = 0
    // D is outside (i.e. below) the image, but the columns change.
    // => D = [height-1, some_column]
    // C = 0 or [height-1, some_column]
    */

    // Create array for Dyy that has image width length
    // all rows (for big part) have same Dyy values
    float Dyy_arr[iwidth];  // stack is faster than heap

    // C = 0 and D = [height-1, some_column]
    // from y = 0 until D is (exclusive) in last column
    for (i = 0; i < width*step-lobe; i += step) {  // 0 - 7
        // C = 0
        // D = [height-1, i+lobe-1]
        D = data[(iheight-1) * data_width + (i+lobe-1)];
        Dyy_arr[i] = D;
    }

    // only bottom left corner value needed
    D = data[(iheight-1) * data_width + (iwidth-1)];

    // C = 0 and D = [height-1, width-1] (below or right of bottom corner)
    // C is still outside and D now too
    for (; i < lobe; i += step) {  // 7 - 25
        Dyy_arr[i] = D;
    }

    // if y = lobe, then C = [height-1, 0]
    // C = [height-1, some_column] and D = [height-1, width-1] (below or right of bottom corner)
    for (; i < width*step; i += step) {  // 25 - 32
        // C = [height-1, i-lobe]
        // D = [height-1, width-1]
        C = data[(iheight-1) * data_width + (i-lobe)];
        Dyy_arr[i] = D - C;
    }

    // Use precomputation for faster compute
    for (x = 0; x < height * step; x += step) {

        // precompute
        t0 = x - lobe;
        t1 = x + lobe - 1;
        t2 = lobe/2 + 1;
        t3 = x - 1;
        t5 = x - lobe - 1;
        t7 = x + lobe;
        t9 = x - lobe / 2 - 1;

        for (y = 0; y < width * step; y += step) {
            // box_integral_unconditional precompute
            t4 = y - 1;
            t6 = y - lobe - 1;
            t8 = y + lobe;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dyy = Dyy_arr[y] - 3 * box_integral_unconditional_opt(iimage, t9, t6 + 1, t9 + lobe , t8 - 2);

            // Compute Dxx, Dxy
            Dxx = box_integral_unconditional_opt(iimage, t0, y-border-1, t1, y+border)
                - 3 * box_integral_unconditional_opt(iimage, t0, y-t2, t1, t8-t2);
            Dxy = box_integral_unconditional_opt(iimage, t5, y, t3, t8)
                    + box_integral_unconditional_opt(iimage, x, t6, t7, t4)
                    - box_integral_unconditional_opt(iimage, t5, t6, t3, t4)
                    - box_integral_unconditional_opt(iimage, x, y, t7, t8);

            // Normalize Responses with inverse area
            Dyy *= inv_area;
            Dxx *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = Dxx + Dyy >= 0;

            // Increment index
            ind += 1;
        }
    }
}